

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

ENetPeer *
enet_protocol_handle_connect(ENetHost *host,ENetProtocolHeader *header,ENetProtocol *command)

{
  byte bVar1;
  ushort uVar2;
  ENetProtocolHeader EVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined8 uVar8;
  size_t *psVar9;
  enet_uint16 eVar10;
  uint uVar11;
  ulong uVar12;
  ENetChannel *pEVar13;
  ENetPeer *pEVar14;
  ENetOutgoingCommand *outgoingCommand;
  byte bVar15;
  byte bVar16;
  enet_uint32 eVar17;
  uint uVar18;
  ENetAddress *pEVar19;
  uint uVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  
  EVar3 = header[4];
  uVar20 = (uint)EVar3 >> 0x18 | ((uint)EVar3 & 0xff0000) >> 8 | ((uint)EVar3 & 0xff00) << 8 |
           (int)EVar3 << 0x18;
  if (uVar20 - 0x100 < 0xffffff01) {
    return (ENetPeer *)0x0;
  }
  if ((long)host->peerCount < 1) {
    uVar12 = 0;
    pEVar14 = (ENetPeer *)0x0;
  }
  else {
    pEVar14 = (ENetPeer *)0x0;
    uVar12 = 0;
    pEVar19 = &host->peers->address;
    do {
      if (*(ENetPeerState *)((long)(pEVar19 + 1) + 8) != ENET_PEER_STATE_CONNECTING) {
        if (*(ENetPeerState *)((long)(pEVar19 + 1) + 8) == ENET_PEER_STATE_DISCONNECTED) {
          if (pEVar14 == (ENetPeer *)0x0) {
            pEVar14 = (ENetPeer *)((long)(pEVar19 + -2) + 4);
          }
        }
        else {
          auVar22[0] = -((host->receivedAddress).host.__in6_u.__u6_addr8[0] ==
                        (pEVar19->host).__in6_u.__u6_addr8[0]);
          auVar22[1] = -((host->receivedAddress).host.__in6_u.__u6_addr8[1] ==
                        (pEVar19->host).__in6_u.__u6_addr8[1]);
          auVar22[2] = -((host->receivedAddress).host.__in6_u.__u6_addr8[2] ==
                        (pEVar19->host).__in6_u.__u6_addr8[2]);
          auVar22[3] = -((host->receivedAddress).host.__in6_u.__u6_addr8[3] ==
                        (pEVar19->host).__in6_u.__u6_addr8[3]);
          auVar22[4] = -((host->receivedAddress).host.__in6_u.__u6_addr8[4] ==
                        (pEVar19->host).__in6_u.__u6_addr8[4]);
          auVar22[5] = -((host->receivedAddress).host.__in6_u.__u6_addr8[5] ==
                        (pEVar19->host).__in6_u.__u6_addr8[5]);
          auVar22[6] = -((host->receivedAddress).host.__in6_u.__u6_addr8[6] ==
                        (pEVar19->host).__in6_u.__u6_addr8[6]);
          auVar22[7] = -((host->receivedAddress).host.__in6_u.__u6_addr8[7] ==
                        (pEVar19->host).__in6_u.__u6_addr8[7]);
          auVar22[8] = -((host->receivedAddress).host.__in6_u.__u6_addr8[8] ==
                        (pEVar19->host).__in6_u.__u6_addr8[8]);
          auVar22[9] = -((host->receivedAddress).host.__in6_u.__u6_addr8[9] ==
                        (pEVar19->host).__in6_u.__u6_addr8[9]);
          auVar22[10] = -((host->receivedAddress).host.__in6_u.__u6_addr8[10] ==
                         (pEVar19->host).__in6_u.__u6_addr8[10]);
          auVar22[0xb] = -((host->receivedAddress).host.__in6_u.__u6_addr8[0xb] ==
                          (pEVar19->host).__in6_u.__u6_addr8[0xb]);
          auVar22[0xc] = -((host->receivedAddress).host.__in6_u.__u6_addr8[0xc] ==
                          (pEVar19->host).__in6_u.__u6_addr8[0xc]);
          auVar22[0xd] = -((host->receivedAddress).host.__in6_u.__u6_addr8[0xd] ==
                          (pEVar19->host).__in6_u.__u6_addr8[0xd]);
          auVar22[0xe] = -((host->receivedAddress).host.__in6_u.__u6_addr8[0xe] ==
                          (pEVar19->host).__in6_u.__u6_addr8[0xe]);
          auVar22[0xf] = -((host->receivedAddress).host.__in6_u.__u6_addr8[0xf] ==
                          (pEVar19->host).__in6_u.__u6_addr8[0xf]);
          if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar22[0xf] >> 7) << 0xf) == 0xffff) {
            if ((pEVar19->port == (host->receivedAddress).port) &&
               (*(ENetProtocolHeader *)((long)(pEVar19 + -1) + 0xc) == header[10])) {
              return (ENetPeer *)0x0;
            }
            uVar12 = uVar12 + 1;
          }
        }
      }
      psVar9 = (size_t *)(pEVar19 + 0x17);
      pEVar19 = (ENetAddress *)((long)(pEVar19 + 0x19) + 4);
    } while (psVar9 + 1 < host->peers + host->peerCount);
  }
  if (pEVar14 == (ENetPeer *)0x0) {
    return (ENetPeer *)0x0;
  }
  if (host->duplicatePeers <= uVar12) {
    return (ENetPeer *)0x0;
  }
  uVar12 = (ulong)uVar20;
  if (host->channelLimit < (ulong)uVar20) {
    uVar12 = host->channelLimit;
  }
  pEVar13 = (ENetChannel *)(*callbacks.malloc)(uVar12 * 0x50);
  if (pEVar13 == (ENetChannel *)0x0) {
    pEVar14 = (ENetPeer *)(*callbacks.no_memory)();
    return pEVar14;
  }
  pEVar14->channels = pEVar13;
  if (pEVar13 == (ENetChannel *)0x0) {
    return (ENetPeer *)0x0;
  }
  pEVar14->channelCount = uVar12;
  pEVar14->state = ENET_PEER_STATE_ACKNOWLEDGING_CONNECT;
  pEVar14->connectID = (enet_uint32)header[10];
  uVar8 = *(undefined8 *)((long)&(host->receivedAddress).host.__in6_u + 8);
  *(undefined8 *)&(pEVar14->address).host.__in6_u =
       *(undefined8 *)&(host->receivedAddress).host.__in6_u;
  *(undefined8 *)((long)&(pEVar14->address).host.__in6_u + 8) = uVar8;
  eVar10 = (host->receivedAddress).sin6_scope_id;
  (pEVar14->address).port = (host->receivedAddress).port;
  (pEVar14->address).sin6_scope_id = eVar10;
  pEVar14->mtu = host->mtu;
  pEVar14->outgoingPeerID = header[1].peerID << 8 | header[1].peerID >> 8;
  EVar3 = header[5];
  pEVar14->incomingBandwidth =
       (uint)EVar3 >> 0x18 | ((uint)EVar3 & 0xff0000) >> 8 | ((uint)EVar3 & 0xff00) << 8 |
       (int)EVar3 << 0x18;
  EVar3 = header[6];
  pEVar14->outgoingBandwidth =
       (uint)EVar3 >> 0x18 | ((uint)EVar3 & 0xff0000) >> 8 | ((uint)EVar3 & 0xff00) << 8 |
       (int)EVar3 << 0x18;
  EVar3 = header[7];
  pEVar14->packetThrottleInterval =
       (uint)EVar3 >> 0x18 | ((uint)EVar3 & 0xff0000) >> 8 | ((uint)EVar3 & 0xff00) << 8 |
       (int)EVar3 << 0x18;
  EVar3 = header[8];
  pEVar14->packetThrottleAcceleration =
       (uint)EVar3 >> 0x18 | ((uint)EVar3 & 0xff0000) >> 8 | ((uint)EVar3 & 0xff00) << 8 |
       (int)EVar3 << 0x18;
  EVar3 = header[9];
  pEVar14->packetThrottleDeceleration =
       (uint)EVar3 >> 0x18 | ((uint)EVar3 & 0xff0000) >> 8 | ((uint)EVar3 & 0xff00) << 8 |
       (int)EVar3 << 0x18;
  EVar3 = header[0xb];
  pEVar14->eventData =
       (uint)EVar3 >> 0x18 | ((uint)EVar3 & 0xff0000) >> 8 | ((uint)EVar3 & 0xff00) << 8 |
       (int)EVar3 << 0x18;
  bVar1 = (byte)header[1].sentTime;
  if (bVar1 == 0xff) {
    bVar1 = pEVar14->outgoingSessionID;
  }
  bVar15 = bVar1 + 1 & 3;
  if (bVar15 == pEVar14->outgoingSessionID) {
    bVar15 = bVar1 & 3 ^ 2;
  }
  pEVar14->outgoingSessionID = bVar15;
  bVar1 = *(byte *)((long)&header[1].sentTime + 1);
  if (bVar1 == 0xff) {
    bVar1 = pEVar14->incomingSessionID;
  }
  bVar16 = bVar1 + 1 & 3;
  if (bVar16 == pEVar14->incomingSessionID) {
    bVar16 = bVar1 & 3 ^ 2;
  }
  pEVar14->incomingSessionID = bVar16;
  if (pEVar13 < pEVar14->channels + uVar12) {
    do {
      pEVar13->outgoingReliableSequenceNumber = 0;
      pEVar13->outgoingUnreliableSequenceNumber = 0;
      pEVar13->incomingUnreliableSequenceNumber = 0;
      (pEVar13->incomingReliableCommands).sentinel.next =
           &(pEVar13->incomingReliableCommands).sentinel;
      (pEVar13->incomingReliableCommands).sentinel.previous =
           &(pEVar13->incomingReliableCommands).sentinel;
      (pEVar13->incomingUnreliableCommands).sentinel.next =
           &(pEVar13->incomingUnreliableCommands).sentinel;
      (pEVar13->incomingUnreliableCommands).sentinel.previous =
           &(pEVar13->incomingUnreliableCommands).sentinel;
      pEVar13->usedReliableWindows = 0;
      pEVar13->reliableWindows[0] = 0;
      pEVar13->reliableWindows[1] = 0;
      pEVar13->reliableWindows[2] = 0;
      pEVar13->reliableWindows[3] = 0;
      pEVar13->reliableWindows[4] = 0;
      pEVar13->reliableWindows[5] = 0;
      pEVar13->reliableWindows[6] = 0;
      pEVar13->reliableWindows[7] = 0;
      pEVar13->reliableWindows[8] = 0;
      pEVar13->reliableWindows[9] = 0;
      pEVar13->reliableWindows[10] = 0;
      pEVar13->reliableWindows[0xb] = 0;
      pEVar13->reliableWindows[0xc] = 0;
      pEVar13->reliableWindows[0xd] = 0;
      pEVar13->reliableWindows[0xe] = 0;
      *(undefined4 *)(pEVar13->reliableWindows + 0xf) = 0;
      pEVar13 = pEVar13 + 1;
    } while (pEVar13 < pEVar14->channels + uVar12);
  }
  EVar3 = header[2];
  uVar20 = (uint)EVar3 >> 0x18 | ((uint)EVar3 & 0xff0000) >> 8 | ((uint)EVar3 & 0xff00) << 8 |
           (int)EVar3 << 0x18;
  if (0xfff < uVar20) {
    uVar20 = 0x1000;
  }
  uVar11 = 0x240;
  if (0x240 < uVar20) {
    uVar11 = uVar20;
  }
  if (uVar11 < pEVar14->mtu) {
    pEVar14->mtu = uVar11;
  }
  uVar20 = host->outgoingBandwidth;
  if (uVar20 == 0) {
    if (pEVar14->incomingBandwidth != 0) goto LAB_00107ff4;
    uVar11 = 0x10000;
  }
  else {
    uVar11 = pEVar14->incomingBandwidth;
    if (uVar11 == 0) {
LAB_00107ff4:
      uVar11 = pEVar14->incomingBandwidth;
      if (pEVar14->incomingBandwidth < uVar20) {
        uVar11 = uVar20;
      }
    }
    else if (uVar20 < uVar11) {
      uVar11 = uVar20;
    }
    uVar11 = uVar11 >> 4 & 0xffff000;
  }
  pEVar14->windowSize = uVar11;
  if (uVar11 == 0) {
    eVar17 = 0x1000;
  }
  else {
    eVar17 = 0x10000;
    if (uVar11 < 0x10001) goto LAB_0010802b;
  }
  pEVar14->windowSize = eVar17;
LAB_0010802b:
  uVar11 = host->incomingBandwidth;
  EVar3 = header[3];
  uVar2 = pEVar14->incomingPeerID;
  uVar4 = pEVar14->mtu;
  uVar5 = pEVar14->packetThrottleInterval;
  uVar6 = pEVar14->packetThrottleAcceleration;
  uVar7 = pEVar14->packetThrottleDeceleration;
  eVar17 = pEVar14->connectID;
  outgoingCommand = (ENetOutgoingCommand *)(*callbacks.malloc)(0x60);
  if (outgoingCommand == (ENetOutgoingCommand *)0x0) {
    pEVar14 = (ENetPeer *)(*callbacks.no_memory)();
    return pEVar14;
  }
  uVar18 = uVar11 >> 4 & 0xffff000;
  if (uVar11 == 0) {
    uVar18 = 0x10000;
  }
  uVar21 = (uint)EVar3 >> 0x18 | ((uint)EVar3 & 0xff0000) >> 8 | ((uint)EVar3 & 0xff00) << 8 |
           (int)EVar3 << 0x18;
  if (uVar18 < uVar21) {
    uVar21 = uVar18;
  }
  if (0xffff < uVar21) {
    uVar21 = 0x10000;
  }
  uVar18 = 0x1000;
  if (0x1000 < uVar21) {
    uVar18 = uVar21;
  }
  *(undefined2 *)&outgoingCommand->command = 0xff83;
  (outgoingCommand->command).acknowledge.receivedReliableSequenceNumber = uVar2 << 8 | uVar2 >> 8;
  (outgoingCommand->command).connect.incomingSessionID = bVar15;
  (outgoingCommand->command).connect.outgoingSessionID = bVar16;
  (outgoingCommand->command).connect.mtu =
       uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  (outgoingCommand->command).connect.windowSize =
       uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  (outgoingCommand->command).connect.channelCount = (int)uVar12 << 0x18;
  (outgoingCommand->command).connect.incomingBandwidth =
       uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  (outgoingCommand->command).connect.outgoingBandwidth =
       uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
  (outgoingCommand->command).connect.packetThrottleInterval =
       uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  (outgoingCommand->command).connect.packetThrottleAcceleration =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  (outgoingCommand->command).connect.packetThrottleDeceleration =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  (outgoingCommand->command).connect.connectID = eVar17;
  outgoingCommand->fragmentOffset = 0;
  outgoingCommand->fragmentLength = 0;
  outgoingCommand->packet = (ENetPacket *)0x0;
  enet_peer_setup_outgoing_command(pEVar14,outgoingCommand);
  return pEVar14;
}

Assistant:

static ENetPeer * enet_protocol_handle_connect(ENetHost *host, ENetProtocolHeader *header, ENetProtocol *command) {
        ENET_UNUSED(header)

        enet_uint8 incomingSessionID, outgoingSessionID;
        enet_uint32 mtu, windowSize;
        ENetChannel *channel;
        size_t channelCount, duplicatePeers = 0;
        ENetPeer *currentPeer, *peer = NULL;
        ENetProtocol verifyCommand;

        channelCount = ENET_NET_TO_HOST_32(command->connect.channelCount);

        if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT || channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT) {
            return NULL;
        }

        for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
            if (currentPeer->state == ENET_PEER_STATE_DISCONNECTED) {
                if (peer == NULL) {
                    peer = currentPeer;
                }
            } else if (currentPeer->state != ENET_PEER_STATE_CONNECTING && in6_equal(currentPeer->address.host, host->receivedAddress.host)) {
                if (currentPeer->address.port == host->receivedAddress.port && currentPeer->connectID == command->connect.connectID) {
                    return NULL;
                }

                ++duplicatePeers;
            }
        }

        if (peer == NULL || duplicatePeers >= host->duplicatePeers) {
            return NULL;
        }

        if (channelCount > host->channelLimit) {
            channelCount = host->channelLimit;
        }
        peer->channels = (ENetChannel *) enet_malloc(channelCount * sizeof(ENetChannel));
        if (peer->channels == NULL) {
            return NULL;
        }
        peer->channelCount               = channelCount;
        peer->state                      = ENET_PEER_STATE_ACKNOWLEDGING_CONNECT;
        peer->connectID                  = command->connect.connectID;
        peer->address                    = host->receivedAddress;
        peer->mtu                        = host->mtu;
        peer->outgoingPeerID             = ENET_NET_TO_HOST_16(command->connect.outgoingPeerID);
        peer->incomingBandwidth          = ENET_NET_TO_HOST_32(command->connect.incomingBandwidth);
        peer->outgoingBandwidth          = ENET_NET_TO_HOST_32(command->connect.outgoingBandwidth);
        peer->packetThrottleInterval     = ENET_NET_TO_HOST_32(command->connect.packetThrottleInterval);
        peer->packetThrottleAcceleration = ENET_NET_TO_HOST_32(command->connect.packetThrottleAcceleration);
        peer->packetThrottleDeceleration = ENET_NET_TO_HOST_32(command->connect.packetThrottleDeceleration);
        peer->eventData                  = ENET_NET_TO_HOST_32(command->connect.data);

        incomingSessionID = command->connect.incomingSessionID == 0xFF ? peer->outgoingSessionID : command->connect.incomingSessionID;
        incomingSessionID = (incomingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
        if (incomingSessionID == peer->outgoingSessionID) {
            incomingSessionID = (incomingSessionID + 1)
              & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
        }
        peer->outgoingSessionID = incomingSessionID;

        outgoingSessionID = command->connect.outgoingSessionID == 0xFF ? peer->incomingSessionID : command->connect.outgoingSessionID;
        outgoingSessionID = (outgoingSessionID + 1) & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
        if (outgoingSessionID == peer->incomingSessionID) {
            outgoingSessionID = (outgoingSessionID + 1)
              & (ENET_PROTOCOL_HEADER_SESSION_MASK >> ENET_PROTOCOL_HEADER_SESSION_SHIFT);
        }
        peer->incomingSessionID = outgoingSessionID;

        for (channel = peer->channels; channel < &peer->channels[channelCount]; ++channel) {
            channel->outgoingReliableSequenceNumber   = 0;
            channel->outgoingUnreliableSequenceNumber = 0;
            channel->incomingReliableSequenceNumber   = 0;
            channel->incomingUnreliableSequenceNumber = 0;

            enet_list_clear(&channel->incomingReliableCommands);
            enet_list_clear(&channel->incomingUnreliableCommands);

            channel->usedReliableWindows = 0;
            memset(channel->reliableWindows, 0, sizeof(channel->reliableWindows));
        }

        mtu = ENET_NET_TO_HOST_32(command->connect.mtu);

        if (mtu < ENET_PROTOCOL_MINIMUM_MTU) {
            mtu = ENET_PROTOCOL_MINIMUM_MTU;
        } else if (mtu > ENET_PROTOCOL_MAXIMUM_MTU) {
            mtu = ENET_PROTOCOL_MAXIMUM_MTU;
        }

        if (mtu < peer->mtu)
            peer->mtu = mtu;

        if (host->outgoingBandwidth == 0 && peer->incomingBandwidth == 0) {
            peer->windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
        } else if (host->outgoingBandwidth == 0 || peer->incomingBandwidth == 0) {
            peer->windowSize = (ENET_MAX(host->outgoingBandwidth, peer->incomingBandwidth) / ENET_PEER_WINDOW_SIZE_SCALE) * ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
        } else {
            peer->windowSize = (ENET_MIN(host->outgoingBandwidth, peer->incomingBandwidth) / ENET_PEER_WINDOW_SIZE_SCALE) * ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
        }

        if (peer->windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE) {
            peer->windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
        } else if (peer->windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE) {
            peer->windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
        }

        if (host->incomingBandwidth == 0) {
            windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
        } else {
            windowSize = (host->incomingBandwidth / ENET_PEER_WINDOW_SIZE_SCALE) * ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
        }

        if (windowSize > ENET_NET_TO_HOST_32(command->connect.windowSize)) {
            windowSize = ENET_NET_TO_HOST_32(command->connect.windowSize);
        }

        if (windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE) {
            windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
        } else if (windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE) {
            windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
        }

        verifyCommand.header.command                            = (int)ENET_PROTOCOL_COMMAND_VERIFY_CONNECT | (int)ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
        verifyCommand.header.channelID                          = 0xFF;
        verifyCommand.verifyConnect.outgoingPeerID              = ENET_HOST_TO_NET_16(peer->incomingPeerID);
        verifyCommand.verifyConnect.incomingSessionID           = incomingSessionID;
        verifyCommand.verifyConnect.outgoingSessionID           = outgoingSessionID;
        verifyCommand.verifyConnect.mtu                         = ENET_HOST_TO_NET_32(peer->mtu);
        verifyCommand.verifyConnect.windowSize                  = ENET_HOST_TO_NET_32(windowSize);
        verifyCommand.verifyConnect.channelCount                = ENET_HOST_TO_NET_32(channelCount);
        verifyCommand.verifyConnect.incomingBandwidth           = ENET_HOST_TO_NET_32(host->incomingBandwidth);
        verifyCommand.verifyConnect.outgoingBandwidth           = ENET_HOST_TO_NET_32(host->outgoingBandwidth);
        verifyCommand.verifyConnect.packetThrottleInterval      = ENET_HOST_TO_NET_32(peer->packetThrottleInterval);
        verifyCommand.verifyConnect.packetThrottleAcceleration  = ENET_HOST_TO_NET_32(peer->packetThrottleAcceleration);
        verifyCommand.verifyConnect.packetThrottleDeceleration  = ENET_HOST_TO_NET_32(peer->packetThrottleDeceleration);
        verifyCommand.verifyConnect.connectID                   = peer->connectID;

        enet_peer_queue_outgoing_command(peer, &verifyCommand, NULL, 0, 0);
        return peer;
    }